

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O3

void readLine(filebuf *file,string *buffer)

{
  byte *pbVar1;
  uint uVar2;
  
  while( true ) {
    pbVar1 = *(byte **)(file + 0x10);
    if (pbVar1 < *(byte **)(file + 0x18)) {
      uVar2 = (uint)*pbVar1;
      *(byte **)(file + 0x10) = pbVar1 + 1;
    }
    else {
      uVar2 = (**(code **)(*(long *)file + 0x50))(file);
      if (uVar2 == 0xffffffff) {
        return;
      }
    }
    if (uVar2 == 10) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (buffer,(char)uVar2);
  }
  if ((buffer->_M_string_length != 0) &&
     ((buffer->_M_dataplus)._M_p[buffer->_M_string_length - 1] == '\r')) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (buffer);
    return;
  }
  return;
}

Assistant:

static void readLine(std::filebuf &file, std::string &buffer) {
	// TODO: maybe this can be optimized to bulk reads?
	for (;;) {
		auto c = file.sbumpc();
		if (c == std::filebuf::traits_type::eof()) {
			return;
		}
		if (c == '\n') {
			// Discard a trailing CRLF
			if (!buffer.empty() && buffer.back() == '\r') {
				buffer.pop_back();
			}
			return;
		}

		buffer.push_back(c);
	}
}